

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O1

XSerializable * xercesc_4_0::DecimalDatatypeValidator::createObject(MemoryManager *manager)

{
  DecimalDatatypeValidator *this;
  
  this = (DecimalDatatypeValidator *)XMemory::operator_new(0xa8,manager);
  DecimalDatatypeValidator(this,manager);
  return (XSerializable *)this;
}

Assistant:

void DecimalDatatypeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     * Note:
     *
     *     During storing, we need write the specific number
     *     type info before calling base::serialize().
     *
     *     While loading, we do nothing here
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) (XMLNumber::BigDecimal);
    }

    AbstractNumericValidator::serialize(serEng);

    //don't serialize XMLBigDecimal*
    if (serEng.isStoring())
    {
        serEng<<fTotalDigits;
        serEng<<fFractionDigits;
    }
    else
    {
        serEng>>fTotalDigits;
        serEng>>fFractionDigits;
    }

}